

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

bool __thiscall wasm::WATParser::anon_unknown_0::LexIntCtx::takeDigit(LexIntCtx *this)

{
  size_t *psVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  string_view sVar5;
  
  if ((this->super_LexCtx).input._M_len != (this->super_LexCtx).lexedSize) {
    sVar5 = LexCtx::next(&this->super_LexCtx);
    bVar3 = *sVar5._M_str;
    bVar4 = bVar3 - 0x3a;
    if (0xf5 < bVar4) {
      psVar1 = &(this->super_LexCtx).lexedSize;
      *psVar1 = *psVar1 + 1;
      uVar2 = (ulong)(bVar3 & 0xf) + this->n * 10;
      if (uVar2 < this->n) {
        this->overflow = true;
      }
      this->n = uVar2;
      if (0xf5 < bVar4) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool takeDigit() {
    if (!empty()) {
      if (auto d = getDigit(peek())) {
        take(1);
        uint64_t newN = n * 10 + *d;
        if (newN < n) {
          overflow = true;
        }
        n = newN;
        return true;
      }
    }
    return false;
  }